

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_blas2.c
# Opt level: O0

int sp_dgemv(char *trans,double alpha,SuperMatrix *A,double *x,int incx,double beta,double *y,
            int incy)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  char local_2a8 [8];
  char msg_1 [256];
  char msg [256];
  int local_98;
  int notran;
  int_t j;
  int_t i;
  int irow;
  int ky;
  int kx;
  int jy;
  int jx;
  int iy;
  int leny;
  int lenx;
  double temp;
  double dStack_60;
  int info;
  double *Aval;
  NCformat *Astore;
  double *pdStack_48;
  int incy_local;
  double *y_local;
  double beta_local;
  double *pdStack_30;
  int incx_local;
  double *x_local;
  SuperMatrix *A_local;
  double alpha_local;
  char *trans_local;
  
  Astore._4_4_ = incy;
  pdStack_48 = y;
  y_local = (double *)beta;
  beta_local._4_4_ = incx;
  pdStack_30 = x;
  x_local = (double *)A;
  A_local = (SuperMatrix *)alpha;
  alpha_local = (double)trans;
  iVar2 = strncmp(trans,"N",1);
  bVar3 = true;
  if (iVar2 != 0) {
    iVar2 = strncmp((char *)alpha_local,"n",1);
    bVar3 = iVar2 == 0;
  }
  Aval = (double *)x_local[3];
  dStack_60 = Aval[1];
  temp._4_4_ = 0;
  if (((bVar3) || (iVar2 = strncmp((char *)alpha_local,"T",1), iVar2 == 0)) ||
     (iVar2 = strncmp((char *)alpha_local,"C",1), iVar2 == 0)) {
    if ((*(int *)((long)x_local + 0xc) < 0) || (*(int *)(x_local + 2) < 0)) {
      temp._4_4_ = 3;
    }
    else if (beta_local._4_4_ == 0) {
      temp._4_4_ = 5;
    }
    else if (Astore._4_4_ == 0) {
      temp._4_4_ = 8;
    }
  }
  else {
    temp._4_4_ = 1;
  }
  if (temp._4_4_ == 0) {
    if (((*(int *)((long)x_local + 0xc) != 0) && (*(int *)(x_local + 2) != 0)) &&
       (((double)A_local != 0.0 ||
        (((NAN((double)A_local) || ((double)y_local != 1.0)) || (NAN((double)y_local))))))) {
      iVar2 = strncmp((char *)alpha_local,"N",1);
      if (iVar2 == 0) {
        iy = *(int *)(x_local + 2);
        jx = *(int *)((long)x_local + 0xc);
      }
      else {
        iy = *(int *)((long)x_local + 0xc);
        jx = *(int *)(x_local + 2);
      }
      if (beta_local._4_4_ < 1) {
        irow = -(iy + -1) * beta_local._4_4_;
      }
      else {
        irow = 0;
      }
      if (Astore._4_4_ < 1) {
        i = -(jx + -1) * Astore._4_4_;
      }
      else {
        i = 0;
      }
      if (((double)y_local != 1.0) || (NAN((double)y_local))) {
        if (Astore._4_4_ == 1) {
          if (((double)y_local != 0.0) || (NAN((double)y_local))) {
            for (notran = 0; notran < jx; notran = notran + 1) {
              pdStack_48[notran] = (double)y_local * pdStack_48[notran];
            }
          }
          else {
            for (notran = 0; notran < jx; notran = notran + 1) {
              pdStack_48[notran] = 0.0;
            }
          }
        }
        else {
          jy = i;
          if (((double)y_local != 0.0) || (NAN((double)y_local))) {
            for (notran = 0; notran < jx; notran = notran + 1) {
              pdStack_48[jy] = (double)y_local * pdStack_48[jy];
              jy = Astore._4_4_ + jy;
            }
          }
          else {
            for (notran = 0; notran < jx; notran = notran + 1) {
              pdStack_48[jy] = 0.0;
              jy = Astore._4_4_ + jy;
            }
          }
        }
      }
      if (((double)A_local != 0.0) || (NAN((double)A_local))) {
        if (bVar3) {
          kx = irow;
          if (Astore._4_4_ == 1) {
            for (local_98 = 0; local_98 < *(int *)(x_local + 2); local_98 = local_98 + 1) {
              if ((pdStack_30[kx] != 0.0) || (NAN(pdStack_30[kx]))) {
                dVar1 = pdStack_30[kx];
                for (notran = *(int *)((long)Aval[3] + (long)local_98 * 4);
                    notran < *(int *)((long)Aval[3] + (long)(local_98 + 1) * 4); notran = notran + 1
                    ) {
                  iVar2 = *(int *)((long)Aval[2] + (long)notran * 4);
                  pdStack_48[iVar2] =
                       (double)A_local * dVar1 * *(double *)((long)dStack_60 + (long)notran * 8) +
                       pdStack_48[iVar2];
                }
              }
              kx = beta_local._4_4_ + kx;
            }
          }
          else {
            sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Not implemented.",0x1ce,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dsp_blas2.c"
                   );
            superlu_abort_and_exit(msg_1 + 0xf8);
          }
        }
        else {
          ky = i;
          if (beta_local._4_4_ == 1) {
            for (local_98 = 0; local_98 < *(int *)(x_local + 2); local_98 = local_98 + 1) {
              _leny = 0.0;
              for (notran = *(int *)((long)Aval[3] + (long)local_98 * 4);
                  notran < *(int *)((long)Aval[3] + (long)(local_98 + 1) * 4); notran = notran + 1)
              {
                _leny = *(double *)((long)dStack_60 + (long)notran * 8) *
                        pdStack_30[*(int *)((long)Aval[2] + (long)notran * 4)] + _leny;
              }
              pdStack_48[ky] = (double)A_local * _leny + pdStack_48[ky];
              ky = Astore._4_4_ + ky;
            }
          }
          else {
            sprintf(local_2a8,"%s at line %d in file %s\n","Not implemented.",0x1de,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dsp_blas2.c"
                   );
            superlu_abort_and_exit(local_2a8);
          }
        }
      }
    }
  }
  else {
    input_error("sp_dgemv ",(int *)((long)&temp + 4));
  }
  return 0;
}

Assistant:

int
sp_dgemv(char *trans, double alpha, SuperMatrix *A, double *x, 
	 int incx, double beta, double *y, int incy)
{
    /* Local variables */
    NCformat *Astore;
    double   *Aval;
    int info;
    double temp;
    int lenx, leny;
    int iy, jx, jy, kx, ky, irow;
    int_t i, j;
    int notran;

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0 )
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_dgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if (A->nrow == 0 || A->ncol == 0 || (alpha == 0. && beta == 1.))
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if (strncmp(trans, "N", 1)==0) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if (beta != 1.) {
	if (incy == 1) {
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) y[i] = 0.;
	    else
		for (i = 0; i < leny; ++i) y[i] = beta * y[i];
	} else {
	    iy = ky;
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) {
		    y[iy] = 0.;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    y[iy] = beta * y[iy];
		    iy += incy;
		}
	}
    }
    
    if (alpha == 0.) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if (x[jx] != 0.) {
		    temp = alpha * x[jx];
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			y[irow] += temp * Aval[i];
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp += Aval[i] * x[irow];
		}
		y[jy] += alpha * temp;
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;
}